

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

char * Diligent::GetInputElementFrequencyString(INPUT_ELEMENT_FREQUENCY Frequency)

{
  char *pcVar1;
  string msg;
  string local_28;
  
  if (Frequency < INPUT_ELEMENT_FREQUENCY_NUM_FREQUENCIES) {
    pcVar1 = &DAT_006697bc + *(int *)(&DAT_006697bc + (ulong)Frequency * 4);
  }
  else {
    FormatString<char[44]>(&local_28,(char (*) [44])"Unknown/unsupported input element frequency");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetInputElementFrequencyString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x6f8);
    std::__cxx11::string::~string((string *)&local_28);
    pcVar1 = "UNKNOWN";
  }
  return pcVar1;
}

Assistant:

const char* GetInputElementFrequencyString(INPUT_ELEMENT_FREQUENCY Frequency)
{
    switch (Frequency)
    {
        case INPUT_ELEMENT_FREQUENCY_UNDEFINED: return "undefined";
        case INPUT_ELEMENT_FREQUENCY_PER_VERTEX: return "per-vertex";
        case INPUT_ELEMENT_FREQUENCY_PER_INSTANCE: return "per-instance";

        default:
            UNEXPECTED("Unknown/unsupported input element frequency");
            return "UNKNOWN";
    }
}